

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

void __thiscall Shell::Run(Shell *this)

{
  int iVar1;
  size_t sVar2;
  char *this_00;
  CommandSptr cmd;
  string s;
  undefined8 *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  do {
    sVar2 = strlen(this->path);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,this->path,sVar2);
    this_00 = "$ ";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"$ ",2);
    GetCommand_abi_cxx11_(&local_50,(Shell *)this_00);
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar1 != 0) {
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      CmdParser::Parse((CmdParser *)&local_80,(string *)this);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if (local_80 != (undefined8 *)0x0) {
        (**(code **)*local_80)();
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  } while (iVar1 != 0);
  return;
}

Assistant:

void Shell::Run(){
	while(true){
		cout << path;
		cout << "$ ";
		auto s = GetCommand();
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}
}